

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOStreamBuffer.h
# Opt level: O0

bool __thiscall Assimp::IOStreamBuffer<char>::readNextBlock(IOStreamBuffer<char> *this)

{
  IOStream *pIVar1;
  int iVar2;
  reference pvVar3;
  undefined4 extraout_var;
  size_t readLen;
  IOStreamBuffer<char> *this_local;
  ulong uVar4;
  
  (*this->m_stream->_vptr_IOStream[4])(this->m_stream,this->m_filePos,0);
  pIVar1 = this->m_stream;
  pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_cache,0);
  iVar2 = (*pIVar1->_vptr_IOStream[2])(pIVar1,pvVar3,1,this->m_cacheSize);
  uVar4 = CONCAT44(extraout_var,iVar2);
  if (uVar4 == 0) {
    this_local._7_1_ = false;
  }
  else {
    if (uVar4 < this->m_cacheSize) {
      this->m_cacheSize = uVar4;
    }
    this->m_filePos = this->m_cacheSize + this->m_filePos;
    this->m_cachePos = 0;
    this->m_blockIdx = this->m_blockIdx + 1;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

AI_FORCE_INLINE
bool IOStreamBuffer<T>::readNextBlock() {
    m_stream->Seek( m_filePos, aiOrigin_SET );
    size_t readLen = m_stream->Read( &m_cache[ 0 ], sizeof( T ), m_cacheSize );
    if ( readLen == 0 ) {
        return false;
    }
    if ( readLen < m_cacheSize ) {
        m_cacheSize = readLen;
    }
    m_filePos += m_cacheSize;
    m_cachePos = 0;
    m_blockIdx++;

    return true;
}